

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basis_function.hpp
# Opt level: O0

vector __thiscall
sisl::basis_function::grad_convolution_sum<3,sisl::body_centered_cubic<char>,sisl::bcc_linear_rdo>
          (basis_function *this,vector *p,body_centered_cubic<char> *lattice)

{
  Index *this_00;
  char cVar1;
  bool bVar2;
  int iVar3;
  reference other;
  undefined4 extraout_var;
  Scalar *pSVar4;
  Index extraout_RDX;
  double dVar5;
  vector vVar6;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<int,_int>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>_>
  local_1b0;
  Matrix<int,__1,_1,_0,__1,_1> local_198;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<int,_int>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>_>
  local_188;
  Type local_170;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<int,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<int,_int>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>_>
  local_148;
  vector local_110;
  double local_100;
  double w;
  undefined1 local_f0 [4];
  int j;
  Matrix<int,__1,_1,_0,__1,_1> local_d8;
  undefined4 local_c4;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<int,_int>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>_>
  local_c0;
  Matrix<int,__1,_1,_0,__1,_1> local_a8;
  undefined1 local_98 [8];
  lattice_site s;
  iterator __end0;
  iterator __begin0;
  vector<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
  *__range2;
  undefined1 local_68 [8];
  lattice_site extent;
  undefined1 local_48 [8];
  lattice_site c;
  vector<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
  sites;
  body_centered_cubic<char> *lattice_local;
  vector *p_local;
  vector *value;
  
  bcc_linear_rdo::get_integer_support<3>();
  (*(lattice->super_base_lattice<char>)._vptr_base_lattice[0xe])(local_48,lattice,p);
  (*(lattice->super_base_lattice<char>)._vptr_base_lattice[10])(local_68);
  __range2._7_1_ = 0;
  __range2._0_4_ = 3;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>
            ((Matrix<double,__1,_1,_0,__1,_1> *)this,(int *)&__range2);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this);
  this_00 = &c.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  __end0 = std::
           vector<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>_>
           ::begin((vector<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
                    *)this_00);
  s.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       (Index)std::
              vector<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>_>
              ::end((vector<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
                     *)this_00);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end0,(__normal_iterator<Eigen::Matrix<int,__1,_1,_0,__1,_1>_*,_std::vector<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>_>
                                     *)&s.
                                        super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                                        m_storage.m_rows), bVar2) {
    other = __gnu_cxx::
            __normal_iterator<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_*,_std::vector<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>_>_>
            ::operator*(&__end0);
    Eigen::Matrix<int,_-1,_1,_0,_-1,_1>::Matrix((Matrix<int,__1,_1,_0,__1,_1> *)local_98,other);
    Eigen::MatrixBase<Eigen::Matrix<int,-1,1,0,-1,1>>::operator+
              (&local_c0,(MatrixBase<Eigen::Matrix<int,_1,1,0,_1,1>> *)local_48,
               (MatrixBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)local_98);
    Eigen::Matrix<int,-1,1,0,-1,1>::
    Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<int,int>,Eigen::Matrix<int,_1,1,0,_1,1>const,Eigen::Matrix<int,_1,1,0,_1,1>const>>
              ((Matrix<int,_1,1,0,_1,1> *)&local_a8,
               (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<int,_int>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
                *)&local_c0);
    iVar3 = (*(lattice->super_base_lattice<char>)._vptr_base_lattice[0x11])(lattice,&local_a8);
    Eigen::Matrix<int,_-1,_1,_0,_-1,_1>::~Matrix(&local_a8);
    if ((((byte)iVar3 ^ 0xff) & 1) == 0) {
      Eigen::MatrixBase<Eigen::Matrix<int,-1,1,0,-1,1>>::operator+
                ((CwiseBinaryOp<Eigen::internal::scalar_sum_op<int,_int>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>_>
                  *)local_f0,(MatrixBase<Eigen::Matrix<int,_1,1,0,_1,1>> *)local_48,
                 (MatrixBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)local_98);
      Eigen::Matrix<int,-1,1,0,-1,1>::
      Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<int,int>,Eigen::Matrix<int,_1,1,0,_1,1>const,Eigen::Matrix<int,_1,1,0,_1,1>const>>
                ((Matrix<int,_1,1,0,_1,1> *)&local_d8,
                 (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<int,_int>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
                  *)local_f0);
      iVar3 = (*(lattice->super_base_lattice<char>)._vptr_base_lattice[0x14])(lattice,&local_d8);
      Eigen::Matrix<int,_-1,_1,_0,_-1,_1>::~Matrix(&local_d8);
      if ((((byte)iVar3 ^ 0xff) & 1) == 0) {
        for (w._4_4_ = 0; w._4_4_ < 3; w._4_4_ = w._4_4_ + 1) {
          Eigen::MatrixBase<Eigen::Matrix<int,-1,1,0,-1,1>>::operator+
                    (&local_188,(MatrixBase<Eigen::Matrix<int,_1,1,0,_1,1>> *)local_48,
                     (MatrixBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)local_98);
          Eigen::
          DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<int,_int>,_const_Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_const_Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>_>
          ::cast<double>(&local_170,
                         (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<int,_int>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
                          *)&local_188);
          Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-
                    (&local_148,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)p,
                     (MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<int,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<int,_int>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>_>
                      *)&local_170);
          Eigen::Matrix<double,-1,1,0,-1,1>::
          Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<int,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<int,int>,Eigen::Matrix<int,_1,1,0,_1,1>const,Eigen::Matrix<int,_1,1,0,_1,1>const>const>const>>
                    ((Matrix<double,_1,1,0,_1,1> *)&local_110,
                     (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<int,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<int,_int>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>_>_>
                      *)&local_148);
          dVar5 = bcc_linear_rdo::dphi<3>(&local_110,(int *)((long)&w + 4));
          Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_110);
          local_100 = dVar5;
          if ((dVar5 != 0.0) || (NAN(dVar5))) {
            Eigen::MatrixBase<Eigen::Matrix<int,-1,1,0,-1,1>>::operator+
                      (&local_1b0,(MatrixBase<Eigen::Matrix<int,_1,1,0,_1,1>> *)local_48,
                       (MatrixBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)local_98);
            Eigen::Matrix<int,-1,1,0,-1,1>::
            Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<int,int>,Eigen::Matrix<int,_1,1,0,_1,1>const,Eigen::Matrix<int,_1,1,0,_1,1>const>>
                      ((Matrix<int,_1,1,0,_1,1> *)&local_198,
                       (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<int,_int>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
                        *)&local_1b0);
            iVar3 = (*(lattice->super_base_lattice<char>)._vptr_base_lattice[5])(lattice,&local_198)
            ;
            cVar1 = *(char *)CONCAT44(extraout_var,iVar3);
            pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                               ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this,
                                (long)w._4_4_);
            *pSVar4 = dVar5 * (double)(int)cVar1 + *pSVar4;
            Eigen::Matrix<int,_-1,_1,_0,_-1,_1>::~Matrix(&local_198);
          }
        }
        local_c4 = 0;
      }
      else {
        local_c4 = 3;
      }
    }
    else {
      local_c4 = 3;
    }
    Eigen::Matrix<int,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<int,__1,_1,_0,__1,_1> *)local_98);
    __gnu_cxx::
    __normal_iterator<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_*,_std::vector<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>_>_>
    ::operator++(&__end0);
  }
  __range2._7_1_ = 1;
  local_c4 = 1;
  Eigen::Matrix<int,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<int,__1,_1,_0,__1,_1> *)local_68);
  Eigen::Matrix<int,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<int,__1,_1,_0,__1,_1> *)local_48);
  std::
  vector<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>_>
  ::~vector((vector<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
             *)&c.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows);
  vVar6.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       extraout_RDX;
  vVar6.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)this;
  return (vector)vVar6.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

static vector grad_convolution_sum(const vector &p, const L *lattice) {
            auto sites = BF::template get_integer_support<N>();
            lattice_site c = lattice->get_nearest_site(p);
            lattice_site extent = lattice->get_dimensions();

            vector value(N);
            value.setZero();

            for(lattice_site s : sites) {
                if(!lattice->is_lattice_site(c+s)) continue;
                if(!lattice->is_filled(c+s)) continue;

                for(int j = 0; j < N; j++) {
                    double w = BF::template dphi<N>(p - (c+s).cast<double>(), j);
                    if(w == 0.) continue;
                    value[j] += w * (double)(*lattice)(c + s);
                }
            }
            return value;
        }